

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigCuts.c
# Opt level: O0

Aig_ManCut_t * Aig_ManCutStart(Aig_Man_t *pMan,int nCutsMax,int nLeafMax,int fTruth,int fVerbose)

{
  int iVar1;
  Aig_ManCut_t *__s;
  Aig_Cut_t **ppAVar2;
  Aig_MmFixed_t *pAVar3;
  uint *puVar4;
  Aig_ManCut_t *p;
  int fVerbose_local;
  int fTruth_local;
  int nLeafMax_local;
  int nCutsMax_local;
  Aig_Man_t *pMan_local;
  
  if (nCutsMax < 2) {
    __assert_fail("nCutsMax >= 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                  ,0x31,"Aig_ManCut_t *Aig_ManCutStart(Aig_Man_t *, int, int, int, int)");
  }
  if (nLeafMax < 0x11) {
    __s = (Aig_ManCut_t *)malloc(0x50);
    memset(__s,0,0x50);
    __s->nCutsMax = nCutsMax;
    __s->nLeafMax = nLeafMax;
    __s->fTruth = fTruth;
    __s->fVerbose = fVerbose;
    __s->pAig = pMan;
    iVar1 = Aig_ManObjNumMax(pMan);
    ppAVar2 = (Aig_Cut_t **)calloc((long)iVar1,8);
    __s->pCuts = ppAVar2;
    iVar1 = Abc_TruthWordNum(nLeafMax);
    __s->nTruthWords = iVar1;
    __s->nCutSize = nLeafMax * 4 + 0x18 + fTruth * 4 * __s->nTruthWords;
    pAVar3 = Aig_MmFixedStart(__s->nCutSize * __s->nCutsMax,0x200);
    __s->pMemCuts = pAVar3;
    if (fTruth != 0) {
      puVar4 = (uint *)malloc((long)(__s->nTruthWords << 2) << 2);
      __s->puTemp[0] = puVar4;
      __s->puTemp[1] = __s->puTemp[0] + __s->nTruthWords;
      __s->puTemp[2] = __s->puTemp[1] + __s->nTruthWords;
      __s->puTemp[3] = __s->puTemp[2] + __s->nTruthWords;
    }
    return __s;
  }
  __assert_fail("nLeafMax <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigCuts.c"
                ,0x32,"Aig_ManCut_t *Aig_ManCutStart(Aig_Man_t *, int, int, int, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Starts the cut sweeping manager.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Aig_ManCut_t * Aig_ManCutStart( Aig_Man_t * pMan, int nCutsMax, int nLeafMax, int fTruth, int fVerbose )
{
    Aig_ManCut_t * p;
    assert( nCutsMax >= 2  );
    assert( nLeafMax <= 16 );
    // allocate the fraiging manager
    p = ABC_ALLOC( Aig_ManCut_t, 1 );
    memset( p, 0, sizeof(Aig_ManCut_t) );
    p->nCutsMax = nCutsMax;
    p->nLeafMax = nLeafMax;
    p->fTruth   = fTruth;
    p->fVerbose = fVerbose;
    p->pAig     = pMan;
    p->pCuts    = ABC_CALLOC( Aig_Cut_t *, Aig_ManObjNumMax(pMan) );
    // allocate memory manager
    p->nTruthWords = Abc_TruthWordNum(nLeafMax);
    p->nCutSize = sizeof(Aig_Cut_t) + sizeof(int) * nLeafMax + fTruth * sizeof(unsigned) * p->nTruthWords;
    p->pMemCuts = Aig_MmFixedStart( p->nCutSize * p->nCutsMax, 512 );
    // room for temporary truth tables
    if ( fTruth )
    {
        p->puTemp[0] = ABC_ALLOC( unsigned, 4 * p->nTruthWords );
        p->puTemp[1] = p->puTemp[0] + p->nTruthWords;
        p->puTemp[2] = p->puTemp[1] + p->nTruthWords;
        p->puTemp[3] = p->puTemp[2] + p->nTruthWords;
    }
    return p;
}